

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O2

int cfl_pick_plane_parameter
              (AV1_COMP *cpi,MACROBLOCK *x,int plane,TX_SIZE tx_size,int cfl_search_range)

{
  BLOCK_SIZE plane_bsize;
  int iVar1;
  int64_t iVar2;
  int64_t iVar3;
  long lVar4;
  uint uVar5;
  int cfl_idx;
  int iVar6;
  int iVar7;
  
  if (cfl_search_range == 0x21) {
    iVar7 = 0x10;
  }
  else {
    plane_bsize = av1_ss_size_lookup[(*(x->e_mbd).mi)->bsize]
                  [(x->e_mbd).plane[(uint)plane].subsampling_x]
                  [(x->e_mbd).plane[(uint)plane].subsampling_y];
    iVar7 = 0x10;
    iVar2 = cfl_compute_rd(cpi,x,plane,tx_size,plane_bsize,0x10,1,(RD_STATS *)0x0);
    for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
      iVar1 = cfl_dir_ls[lVar4];
      iVar6 = 0x21;
      iVar3 = iVar2;
      uVar5 = iVar1 - 0x11;
      cfl_idx = iVar7;
      do {
        iVar7 = cfl_idx;
        iVar2 = iVar3;
        iVar6 = iVar6 + -1;
        if ((iVar6 == 0) || (uVar5 < 0xffffffdf)) break;
        cfl_idx = uVar5 + 0x21;
        iVar3 = cfl_compute_rd(cpi,x,plane,tx_size,plane_bsize,cfl_idx,1,(RD_STATS *)0x0);
        uVar5 = uVar5 + iVar1;
      } while (iVar3 < iVar2);
    }
  }
  return iVar7;
}

Assistant:

static int cfl_pick_plane_parameter(const AV1_COMP *const cpi, MACROBLOCK *x,
                                    int plane, TX_SIZE tx_size,
                                    int cfl_search_range) {
  assert(cfl_search_range >= 1 && cfl_search_range <= CFL_MAGS_SIZE);

  if (cfl_search_range == CFL_MAGS_SIZE) return CFL_INDEX_ZERO;

  const MACROBLOCKD *const xd = &x->e_mbd;
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  assert(mbmi->uv_mode == UV_CFL_PRED);
  const MACROBLOCKD_PLANE *pd = &xd->plane[plane];
  const BLOCK_SIZE plane_bsize =
      get_plane_block_size(mbmi->bsize, pd->subsampling_x, pd->subsampling_y);

  int est_best_cfl_idx = CFL_INDEX_ZERO;
  int fast_mode = 1;
  int start_cfl_idx = CFL_INDEX_ZERO;
  int64_t best_cfl_cost = cfl_compute_rd(cpi, x, plane, tx_size, plane_bsize,
                                         start_cfl_idx, fast_mode, NULL);
  for (int si = 0; si < 2; ++si) {
    const int dir = cfl_dir_ls[si];
    for (int i = 1; i < CFL_MAGS_SIZE; ++i) {
      int cfl_idx = start_cfl_idx + dir * i;
      if (cfl_idx < 0 || cfl_idx >= CFL_MAGS_SIZE) break;
      int64_t cfl_cost = cfl_compute_rd(cpi, x, plane, tx_size, plane_bsize,
                                        cfl_idx, fast_mode, NULL);
      if (cfl_cost < best_cfl_cost) {
        best_cfl_cost = cfl_cost;
        est_best_cfl_idx = cfl_idx;
      } else {
        break;
      }
    }
  }
  return est_best_cfl_idx;
}